

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::ssl_parse_client_hello_with_trailing_data(SSL *ssl,CBS *cbs,SSL_CLIENT_HELLO *out)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  uint8_t *puVar4;
  size_t sVar5;
  undefined1 local_98 [8];
  CBS extensions;
  CBS compression_methods;
  CBS cipher_suites;
  CBS cookie;
  CBS session_id;
  CBS random;
  CBS copy;
  SSL_CLIENT_HELLO *out_local;
  CBS *cbs_local;
  SSL *ssl_local;
  
  ::OPENSSL_memset(out,0,0x80);
  out->ssl = ssl;
  random.len = (size_t)cbs->data;
  iVar2 = CBS_get_u16(cbs,&out->version);
  if ((((iVar2 == 0) || (iVar2 = CBS_get_bytes(cbs,(CBS *)&session_id.len,0x20), iVar2 == 0)) ||
      (iVar2 = CBS_get_u8_length_prefixed(cbs,(CBS *)&cookie.len), iVar2 == 0)) ||
     (sVar3 = CBS_len((CBS *)&cookie.len), 0x20 < sVar3)) {
    ERR_put_error(0x10,0,0x83,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                  ,0x7a);
    return false;
  }
  puVar4 = CBS_data((CBS *)&session_id.len);
  out->random = puVar4;
  sVar3 = CBS_len((CBS *)&session_id.len);
  out->random_len = sVar3;
  puVar4 = CBS_data((CBS *)&cookie.len);
  out->session_id = puVar4;
  sVar3 = CBS_len((CBS *)&cookie.len);
  out->session_id_len = sVar3;
  iVar2 = SSL_is_dtls(out->ssl);
  if (iVar2 == 0) {
    out->dtls_cookie = (uint8_t *)0x0;
    out->dtls_cookie_len = 0;
  }
  else {
    iVar2 = CBS_get_u8_length_prefixed(cbs,(CBS *)&cipher_suites.len);
    if (iVar2 == 0) {
      ERR_put_error(0x10,0,0x83,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                    ,0x86);
      return false;
    }
    puVar4 = CBS_data((CBS *)&cipher_suites.len);
    out->dtls_cookie = puVar4;
    sVar3 = CBS_len((CBS *)&cipher_suites.len);
    out->dtls_cookie_len = sVar3;
  }
  iVar2 = CBS_get_u16_length_prefixed(cbs,(CBS *)&compression_methods.len);
  if (((iVar2 != 0) && (sVar3 = CBS_len((CBS *)&compression_methods.len), 1 < sVar3)) &&
     ((sVar3 = CBS_len((CBS *)&compression_methods.len), (sVar3 & 1) == 0 &&
      ((iVar2 = CBS_get_u8_length_prefixed(cbs,(CBS *)&extensions.len), iVar2 != 0 &&
       (sVar3 = CBS_len((CBS *)&extensions.len), sVar3 != 0)))))) {
    puVar4 = CBS_data((CBS *)&compression_methods.len);
    out->cipher_suites = puVar4;
    sVar3 = CBS_len((CBS *)&compression_methods.len);
    out->cipher_suites_len = sVar3;
    puVar4 = CBS_data((CBS *)&extensions.len);
    out->compression_methods = puVar4;
    sVar3 = CBS_len((CBS *)&extensions.len);
    out->compression_methods_len = sVar3;
    sVar3 = CBS_len(cbs);
    if (sVar3 == 0) {
      out->extensions = (uint8_t *)0x0;
      out->extensions_len = 0;
    }
    else {
      iVar2 = CBS_get_u16_length_prefixed(cbs,(CBS *)local_98);
      if ((iVar2 == 0) || (bVar1 = tls1_check_duplicate_extensions((CBS *)local_98), !bVar1)) {
        ERR_put_error(0x10,0,0x83,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                      ,0xa8);
        return false;
      }
      puVar4 = CBS_data((CBS *)local_98);
      out->extensions = puVar4;
      sVar3 = CBS_len((CBS *)local_98);
      out->extensions_len = sVar3;
    }
    puVar4 = CBS_data((CBS *)&random.len);
    out->client_hello = puVar4;
    sVar3 = CBS_len((CBS *)&random.len);
    sVar5 = CBS_len(cbs);
    out->client_hello_len = sVar3 - sVar5;
    return true;
  }
  ERR_put_error(0x10,0,0x83,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                ,0x95);
  return false;
}

Assistant:

bool ssl_parse_client_hello_with_trailing_data(const SSL *ssl, CBS *cbs,
                                               SSL_CLIENT_HELLO *out) {
  OPENSSL_memset(out, 0, sizeof(*out));
  out->ssl = const_cast<SSL *>(ssl);

  CBS copy = *cbs;
  CBS random, session_id;
  if (!CBS_get_u16(cbs, &out->version) ||
      !CBS_get_bytes(cbs, &random, SSL3_RANDOM_SIZE) ||
      !CBS_get_u8_length_prefixed(cbs, &session_id) ||
      CBS_len(&session_id) > SSL_MAX_SSL_SESSION_ID_LENGTH) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_CLIENTHELLO_PARSE_FAILED);
    return false;
  }

  out->random = CBS_data(&random);
  out->random_len = CBS_len(&random);
  out->session_id = CBS_data(&session_id);
  out->session_id_len = CBS_len(&session_id);

  if (SSL_is_dtls(out->ssl)) {
    CBS cookie;
    if (!CBS_get_u8_length_prefixed(cbs, &cookie)) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_CLIENTHELLO_PARSE_FAILED);
      return false;
    }
    out->dtls_cookie = CBS_data(&cookie);
    out->dtls_cookie_len = CBS_len(&cookie);
  } else {
    out->dtls_cookie = nullptr;
    out->dtls_cookie_len = 0;
  }

  CBS cipher_suites, compression_methods;
  if (!CBS_get_u16_length_prefixed(cbs, &cipher_suites) ||
      CBS_len(&cipher_suites) < 2 || (CBS_len(&cipher_suites) & 1) != 0 ||
      !CBS_get_u8_length_prefixed(cbs, &compression_methods) ||
      CBS_len(&compression_methods) < 1) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_CLIENTHELLO_PARSE_FAILED);
    return false;
  }

  out->cipher_suites = CBS_data(&cipher_suites);
  out->cipher_suites_len = CBS_len(&cipher_suites);
  out->compression_methods = CBS_data(&compression_methods);
  out->compression_methods_len = CBS_len(&compression_methods);

  // If the ClientHello ends here then it's valid, but doesn't have any
  // extensions.
  if (CBS_len(cbs) == 0) {
    out->extensions = nullptr;
    out->extensions_len = 0;
  } else {
    // Extract extensions and check it is valid.
    CBS extensions;
    if (!CBS_get_u16_length_prefixed(cbs, &extensions) ||
        !tls1_check_duplicate_extensions(&extensions)) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_CLIENTHELLO_PARSE_FAILED);
      return false;
    }
    out->extensions = CBS_data(&extensions);
    out->extensions_len = CBS_len(&extensions);
  }

  out->client_hello = CBS_data(&copy);
  out->client_hello_len = CBS_len(&copy) - CBS_len(cbs);
  return true;
}